

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<short,_true,_std::allocator<unsigned_long>_>::indexToOffset
          (View<short,_true,_std::allocator<unsigned_long>_> *this,size_t index,size_t *out)

{
  long lVar1;
  long lVar2;
  long lVar3;
  runtime_error *this_00;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  testInvariant(this);
  if (index < *(ulong *)(this + 0x30)) {
    testInvariant(this);
    if (this[0x3c] == (View<short,_true,_std::allocator<unsigned_long>_>)0x1) {
      *out = index;
      return;
    }
    *out = 0;
    testInvariant(this);
    lVar1 = *(long *)this;
    if (*(int *)(this + 0x38) == 0) {
      if (lVar1 != 0) {
        sVar5 = *out;
        lVar2 = *(long *)(this + 0x18);
        lVar3 = *(long *)(this + 0x20);
        uVar4 = 0;
        do {
          if (*(ulong *)(this + 0x28) <= uVar4) {
            return;
          }
          if (*(ulong *)(this + 0x28) <= uVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_00219015;
          }
          sVar5 = sVar5 + (index / *(ulong *)(lVar2 + uVar4 * 8)) * *(long *)(lVar3 + uVar4 * 8);
          *out = sVar5;
          if (*(ulong *)(this + 0x28) <= uVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_00219015;
          }
          index = index % *(ulong *)(lVar2 + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (lVar1 != 0);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else if (lVar1 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else if (*(long *)(this + 0x28) == 0) {
      if (index == 0) {
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else {
      uVar4 = *(long *)(this + 0x28) - 1;
      if (uVar4 < *(ulong *)(this + 0x28)) {
        lVar1 = *(long *)(this + 0x18);
        lVar2 = *(long *)(this + 0x20);
        do {
          *out = *out + (index / *(ulong *)(lVar1 + uVar4 * 8)) * *(long *)(lVar2 + uVar4 * 8);
          if (*(ulong *)(this + 0x28) <= uVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_00219015;
          }
          uVar6 = uVar4 - 1;
          if (uVar4 == 0) {
            return;
          }
          index = index % *(ulong *)(lVar1 + uVar4 * 8);
          uVar4 = uVar6;
        } while (uVar6 < *(ulong *)(this + 0x28));
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_00219015:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
View<T, isConst, A>::indexToOffset
(
    std::size_t index,
    std::size_t& out
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index < this->size()); 
    if(isSimple()) {
        out = index;
    }
    else {
        out = 0;
        if(coordinateOrder() == FirstMajorOrder) {
            for(std::size_t j=0; j<this->dimension(); ++j) {
                out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                index = index % geometry_.shapeStrides(j);
            }
        }
        else { // last major order
            if(this->dimension() == 0) {
                marray_detail::Assert(MARRAY_NO_ARG_TEST || index == 0);
                return;
            }
            else {
                std::size_t j = this->dimension()-1;
                for(;;) {
                    out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                    index = index % geometry_.shapeStrides(j);
                    if(j == 0) {
                        break;
                    }
                    else {
                        --j;
                    }
                }
            }
        }
    }
}